

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void anon_unknown.dwarf_e2799::compareBuffer
               (SimdAlignedBuffer64f *src,SimdAlignedBuffer64f *dst,float errThresh)

{
  ostream *poVar1;
  void *pvVar2;
  long *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  SimdAlignedBuffer64f *buffer;
  double diff;
  int i;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (0x3f < local_18) {
      return;
    }
    dVar3 = std::fabs((double)(ulong)(uint)(*(float *)(*in_RDI + (long)local_18 * 4) -
                                           *(float *)(*in_RSI + (long)local_18 * 4)));
    buffer = (SimdAlignedBuffer64f *)(double)SUB84(dVar3,0);
    if ((double)in_XMM0_Da < (double)buffer) break;
    local_18 = local_18 + 1;
  }
  std::ostream::operator<<(&std::cout,std::scientific);
  poVar1 = std::operator<<((ostream *)&std::cout,"Error exceeded threshold on element ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_18);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," diff: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(double)buffer);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Goal (src): ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::scientific);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  dumpBuffer(buffer);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test (dst): ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dumpBuffer(buffer);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                ,0x57,
                "void (anonymous namespace)::compareBuffer(const SimdAlignedBuffer64f &, const SimdAlignedBuffer64f &, const float)"
               );
}

Assistant:

void
compareBuffer (const SimdAlignedBuffer64f &src,
               const SimdAlignedBuffer64f &dst,
               const float                 errThresh)
{
    for (int i=0; i<64; ++i) 
    {
        double diff   = fabs(src._buffer[i] - dst._buffer[i]);

        if (diff > errThresh) 
        {
            cout << scientific;
            cout << "Error exceeded threshold on element "  << i << endl;
            cout << " diff: " << diff << endl;
            cout << "Goal (src): " << scientific << endl;
            dumpBuffer(src);
            cout << "Test (dst): " << endl;
            dumpBuffer(dst);

            assert(false);
        }
    }
}